

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.h
# Opt level: O2

void __thiscall markdown::token::Image::~Image(Image *this)

{
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Image_00171830;
  std::__cxx11::string::~string((string *)&this->mTitle);
  std::__cxx11::string::~string((string *)&this->mUrl);
  std::__cxx11::string::~string((string *)&this->mAltText);
  return;
}

Assistant:

Image(const std::string& altText, const std::string& url, const std::string&
		title): mAltText(altText), mUrl(url), mTitle(title) { }